

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O3

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_charset_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  compiler_token_type cVar4;
  long lVar5;
  regex_error local_48;
  
  pcVar3 = *begin;
  cVar2 = *pcVar3;
  lVar5 = 1;
  switch(cVar2) {
  case '[':
    if (pcVar3 + 1 == end) {
      return token_literal;
    }
    cVar2 = pcVar3[1];
    if (cVar2 != ':') {
      if (cVar2 == '.') {
        std::runtime_error::runtime_error
                  (&local_48.super_runtime_error,"collation sequences are not yet supported");
        local_48.super_exception.data_.px_ = (error_info_container *)0x0;
        local_48._0_8_ = &PTR__regex_error_00193398;
        local_48.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_001933c0;
        local_48.code_ = error_collate;
        local_48.super_exception.throw_function_ =
             "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_charset_token(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
        ;
        local_48.super_exception.throw_file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
        ;
        local_48.super_exception.throw_line_ = 0x13b;
        local_48.super_exception.throw_column_ = -1;
        throw_exception<boost::xpressive::regex_error>(&local_48);
      }
      if (cVar2 != '=') {
        return token_literal;
      }
      std::runtime_error::runtime_error
                (&local_48.super_runtime_error,"equivalence classes are not yet supported");
      local_48.super_exception.data_.px_ = (error_info_container *)0x0;
      local_48._0_8_ = &PTR__regex_error_00193398;
      local_48.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_001933c0;
      local_48.code_ = error_collate;
      local_48.super_exception.throw_function_ =
           "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_charset_token(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
      ;
      local_48.super_exception.throw_file_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
      ;
      local_48.super_exception.throw_line_ = 0x135;
      local_48.super_exception.throw_column_ = -1;
      throw_exception<boost::xpressive::regex_error>(&local_48);
    }
    cVar4 = token_posix_charset_begin;
    break;
  case '\\':
    pcVar1 = pcVar3 + 1;
    *begin = pcVar1;
    if (pcVar1 == end) {
      return token_escape;
    }
    if (*pcVar1 != 'b') {
      return token_escape;
    }
    cVar4 = token_charset_backspace;
    break;
  case ']':
    cVar4 = token_charset_end;
    goto LAB_00138708;
  case '^':
    cVar4 = token_charset_invert;
    goto LAB_00138708;
  default:
    if (cVar2 != ':') {
      if (cVar2 != '-') {
        return token_literal;
      }
      cVar4 = token_charset_hyphen;
      goto LAB_00138708;
    }
    if (pcVar3 + 1 == end) {
      return token_literal;
    }
    if (pcVar3[1] != ']') {
      return token_literal;
    }
    cVar4 = token_posix_charset_end;
  }
  lVar5 = 2;
LAB_00138708:
  *begin = pcVar3 + lVar5;
  return cVar4;
}

Assistant:

regex_constants::compiler_token_type get_charset_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, '^'): ++begin; return token_charset_invert;
        case BOOST_XPR_CHAR_(char_type, '-'): ++begin; return token_charset_hyphen;
        case BOOST_XPR_CHAR_(char_type, ']'): ++begin; return token_charset_end;
        case BOOST_XPR_CHAR_(char_type, '['):
            {
                FwdIter next = begin; ++next;
                if(next != end)
                {
                    BOOST_XPR_ENSURE_(
                        *next != BOOST_XPR_CHAR_(char_type, '=')
                      , error_collate
                      , "equivalence classes are not yet supported"
                    );

                    BOOST_XPR_ENSURE_(
                        *next != BOOST_XPR_CHAR_(char_type, '.')
                      , error_collate
                      , "collation sequences are not yet supported"
                    );

                    if(*next == BOOST_XPR_CHAR_(char_type, ':'))
                    {
                        begin = ++next;
                        return token_posix_charset_begin;
                    }
                }
            }
            break;
        case BOOST_XPR_CHAR_(char_type, ':'):
            {
                FwdIter next = begin; ++next;
                if(next != end && *next == BOOST_XPR_CHAR_(char_type, ']'))
                {
                    begin = ++next;
                    return token_posix_charset_end;
                }
            }
            break;
        case BOOST_XPR_CHAR_(char_type, '\\'):
            if(++begin != end)
            {
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, 'b'): ++begin; return token_charset_backspace;
                default:;
                }
            }
            return token_escape;
        default:;
        }
        return token_literal;
    }